

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField(ExtensionSet *this,int number)

{
  _Base_ptr p_Var1;
  LogMessage *pLVar2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  LogFinisher local_59;
  LogMessage local_58;
  
  p_Var3 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &p_Var3->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < number]) {
    if (number <= (int)p_Var4[1]._M_color) {
      p_Var1 = p_Var4;
    }
  }
  p_Var4 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var1 != p_Var3) && (p_Var4 = p_Var1, number < (int)p_Var1[1]._M_color))
  {
    p_Var4 = &p_Var3->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var3) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x137);
    pLVar2 = LogMessage::operator<<(&local_58,"CHECK failed: iter != extensions_.end(): ");
    pLVar2 = LogMessage::operator<<(pLVar2,"no extension numbered ");
    pLVar2 = LogMessage::operator<<(pLVar2,number);
    LogFinisher::operator=(&local_59,pLVar2);
    LogMessage::~LogMessage(&local_58);
  }
  return p_Var4[1]._M_parent;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number) {
  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  map<int, Extension>::const_iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "no extension numbered " << number;
  return iter->second.repeated_int32_value;
}